

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void statement(LexState *ls)

{
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  FuncState *pFVar5;
  FuncState *pFVar6;
  Dyndata *pDVar7;
  Instruction *pIVar8;
  int iVar9;
  int list;
  int iVar10;
  uint uVar11;
  TString *pTVar12;
  TString *pTVar13;
  long lVar14;
  Labeldesc *pLVar15;
  ushort uVar16;
  uint base;
  char *pcVar17;
  FuncState *fs;
  Labellist *l;
  expdesc v;
  int escapelist;
  expdesc v_1;
  undefined1 local_78 [8];
  expdesc local_70;
  uint local_58;
  int local_54;
  undefined1 local_50 [16];
  undefined4 local_40;
  int local_3c;
  FuncState *local_38;
  
  uVar4 = ls->linenumber;
  pFVar5 = ls->fs;
  uVar16 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar16;
  if (200 < uVar16) {
    errorlimit(pFVar5,200,"C levels");
  }
  iVar10 = (ls->t).token;
  switch(iVar10) {
  case 0x102:
  case 0x10a:
    iVar10 = luaK_jump(pFVar5);
    gotostat(ls,iVar10);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,uVar4);
    break;
  case 0x108:
    local_40 = CONCAT13(local_40._3_1_,0x10000);
    pDVar7 = pFVar5->ls->dyd;
    local_50._8_4_ = (pDVar7->label).n;
    local_50._12_4_ = (pDVar7->gt).n;
    local_40._0_2_ = (ushort)pFVar5->nactvar;
    local_50._0_8_ = pFVar5->bl;
    pFVar5->bl = (BlockCnt *)local_50;
    luaX_next(ls);
    pTVar13 = str_checkname(ls);
    iVar10 = (ls->t).token;
    if ((iVar10 == 0x2c) || (iVar10 == 0x10c)) {
      local_38 = ls->fs;
      local_58 = (uint)local_38->freereg;
      pTVar12 = luaX_newstring(ls,"(for generator)",0xf);
      new_localvar(ls,pTVar12);
      pTVar12 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar12);
      pTVar12 = luaX_newstring(ls,"(for control)",0xd);
      new_localvar(ls,pTVar12);
      new_localvar(ls,pTVar13);
      iVar10 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar13 = str_checkname(ls);
        new_localvar(ls,pTVar13);
        iVar10 = iVar10 + 1;
      }
      checknext(ls,0x10c);
      uVar11 = ls->linenumber;
      iVar9 = explist(ls,(expdesc *)local_78);
      adjust_assign(ls,3,iVar9,(expdesc *)local_78);
      luaK_checkstack(local_38,3);
      iVar9 = 0;
      base = local_58;
    }
    else {
      if (iVar10 != 0x3d) {
        pcVar17 = "\'=\' or \'in\' expected";
        goto LAB_00113f5b;
      }
      pFVar6 = ls->fs;
      bVar2 = pFVar6->freereg;
      pTVar12 = luaX_newstring(ls,"(for index)",0xb);
      new_localvar(ls,pTVar12);
      pTVar12 = luaX_newstring(ls,"(for limit)",0xb);
      new_localvar(ls,pTVar12);
      pTVar12 = luaX_newstring(ls,"(for step)",10);
      new_localvar(ls,pTVar12);
      new_localvar(ls,pTVar13);
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_78,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      }
      else {
        bVar3 = pFVar6->freereg;
        iVar10 = luaK_intK(pFVar6,1);
        luaK_codek(pFVar6,(uint)bVar3,iVar10);
        luaK_reserveregs(pFVar6,1);
      }
      iVar10 = 1;
      iVar9 = 1;
      base = (uint)bVar2;
      uVar11 = uVar4;
    }
    forbody(ls,base,uVar11,iVar10,iVar9);
    check_match(ls,0x106,0x108,uVar4);
    goto LAB_00113eb0;
  case 0x109:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_78);
    while (iVar10 = (ls->t).token, iVar10 == 0x2e) {
      fieldsel(ls,(expdesc *)local_78);
    }
    if (iVar10 == 0x3a) {
      fieldsel(ls,(expdesc *)local_78);
    }
    body(ls,(expdesc *)local_50,(uint)(iVar10 == 0x3a),uVar4);
    luaK_storevar(ls->fs,(expdesc *)local_78,(expdesc *)local_50);
    luaK_fixline(ls->fs,uVar4);
    break;
  case 0x10b:
    local_54 = -1;
    local_58 = uVar4;
LAB_001136b3:
    pFVar6 = ls->fs;
    luaX_next(ls);
    subexpr(ls,(expdesc *)local_50,0);
    checknext(ls,0x113);
    if (((ls->t).token | 8U) == 0x10a) {
      luaK_goiffalse(ls->fs,(expdesc *)local_50);
      uVar4 = (uint)local_70.u._0_4_ >> 0x10;
      pDVar7 = pFVar6->ls->dyd;
      local_70.k = (pDVar7->label).n;
      local_70._4_4_ = (pDVar7->gt).n;
      local_70.u.ind.idx = CONCAT11(0,pFVar6->nactvar);
      local_70.u.info = CONCAT22((short)uVar4,local_70.u.ind.idx) & 0xff00ffff;
      local_78 = (undefined1  [8])pFVar6->bl;
      pFVar6->bl = (BlockCnt *)local_78;
      gotostat(ls,local_40);
      do {
        iVar10 = (ls->t).token;
        if (iVar10 < 0x120) {
          if (iVar10 != 0x3b) goto LAB_00113758;
        }
        else if (iVar10 != 0x120) {
          if (iVar10 == 0x121) goto LAB_00113762;
          goto LAB_001137bd;
        }
        statement(ls);
      } while( true );
    }
    luaK_goiftrue(ls->fs,(expdesc *)local_50);
    uVar4 = (uint)local_70.u._0_4_ >> 0x10;
    pDVar7 = pFVar6->ls->dyd;
    local_70.k = (pDVar7->label).n;
    local_70._4_4_ = (pDVar7->gt).n;
    local_70.u.ind.idx = CONCAT11(0,pFVar6->nactvar);
    local_70.u.info = CONCAT22((short)uVar4,local_70.u.ind.idx) & 0xff00ffff;
    local_78 = (undefined1  [8])pFVar6->bl;
    pFVar6->bl = (BlockCnt *)local_78;
    iVar10 = local_3c;
    goto LAB_001137c8;
  case 0x10d:
    luaX_next(ls);
    if ((ls->t).token == 0x109) {
      luaX_next(ls);
      pFVar5 = ls->fs;
      pTVar13 = str_checkname(ls);
      new_localvar(ls,pTVar13);
      adjustlocalvars((LexState *)ls->fs,1);
      body(ls,(expdesc *)local_78,0,ls->linenumber);
      pFVar5->f->locvars
      [(pFVar5->ls->dyd->actvar).arr[(long)pFVar5->firstlocal + (long)(int)local_70.k].idx].startpc
           = pFVar5->pc;
    }
    else {
      pTVar13 = str_checkname(ls);
      new_localvar(ls,pTVar13);
      iVar9 = 1;
      iVar10 = (ls->t).token;
      while (iVar10 == 0x2c) {
        luaX_next(ls);
        pTVar13 = str_checkname(ls);
        new_localvar(ls,pTVar13);
        iVar9 = iVar9 + 1;
        iVar10 = (ls->t).token;
      }
      if (iVar10 == 0x3d) {
        luaX_next(ls);
        iVar10 = explist(ls,(expdesc *)local_78);
      }
      else {
        local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
        iVar10 = 0;
      }
      adjust_assign(ls,iVar9,iVar10,(expdesc *)local_78);
      adjustlocalvars((LexState *)ls->fs,iVar9);
    }
    break;
  case 0x111:
    iVar10 = luaK_getlabel(pFVar5);
    local_70.u.ival._0_3_ = 0x10000;
    pDVar7 = pFVar5->ls->dyd;
    local_70.k = (pDVar7->label).n;
    local_70._4_4_ = (pDVar7->gt).n;
    local_70.u.ival._1_1_ = 0;
    local_70.u.ival._0_1_ = pFVar5->nactvar;
    local_78 = (undefined1  [8])pFVar5->bl;
    local_40._0_3_ = (uint3)pFVar5->nactvar;
    pFVar5->bl = (BlockCnt *)local_50;
    local_50._0_8_ = (BlockCnt *)local_78;
    local_50._8_4_ = local_70.k;
    local_50._12_4_ = local_70._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x115,0x111,uVar4);
    iVar9 = cond(ls);
    if (local_40._1_1_ != '\0') {
      luaK_patchclose(pFVar5,iVar9,local_40 & 0xff);
    }
    leaveblock(pFVar5);
    luaK_patchlist(pFVar5,iVar9,iVar10);
LAB_00113eb0:
    leaveblock(pFVar5);
    break;
  case 0x112:
    luaX_next(ls);
    pFVar5 = ls->fs;
    iVar10 = (ls->t).token;
    uVar11 = 0;
    uVar4 = iVar10 - 0x104;
    if ((uVar4 < 0x1e) && ((0x20020007U >> (uVar4 & 0x1f) & 1) != 0)) {
      iVar9 = 0;
      uVar11 = 0;
    }
    else {
      iVar9 = 0;
      if (iVar10 != 0x3b) {
        iVar9 = explist(ls,(expdesc *)local_78);
        if (local_78._0_4_ - VCALL < 2) {
          luaK_setreturns(pFVar5,(expdesc *)local_78,-1);
          if (iVar9 == 1 && local_78._0_4_ == VCALL) {
            pIVar8 = pFVar5->f->code;
            pIVar8[(int)local_70.k] = pIVar8[(int)local_70.k] & 0xffffffc0 | 0x25;
          }
          uVar11 = (uint)pFVar5->nactvar;
          iVar9 = -1;
        }
        else if (iVar9 == 1) {
          uVar11 = luaK_exp2anyreg(pFVar5,(expdesc *)local_78);
          iVar9 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar5,(expdesc *)local_78);
          uVar11 = (uint)pFVar5->nactvar;
        }
      }
    }
    luaK_ret(pFVar5,uVar11,iVar9);
    if ((ls->t).token != 0x3b) break;
LAB_00113593:
    luaX_next(ls);
    break;
  case 0x116:
    luaX_next(ls);
    iVar9 = luaK_getlabel(pFVar5);
    iVar10 = cond(ls);
    local_70.u.ival._0_3_ = 0x10000;
    pDVar7 = pFVar5->ls->dyd;
    local_70.k = (pDVar7->label).n;
    local_70._4_4_ = (pDVar7->gt).n;
    local_70.u.ival._1_1_ = 0;
    local_70.u.ival._0_1_ = pFVar5->nactvar;
    local_78 = (undefined1  [8])pFVar5->bl;
    pFVar5->bl = (BlockCnt *)local_78;
    checknext(ls,0x103);
    block(ls);
    list = luaK_jump(pFVar5);
    luaK_patchlist(pFVar5,list,iVar9);
    check_match(ls,0x106,0x116,uVar4);
    leaveblock(pFVar5);
    goto LAB_00113b03;
  default:
    if (iVar10 == 0x120) {
      luaX_next(ls);
      pTVar13 = str_checkname(ls);
      pFVar5 = ls->fs;
      iVar10 = pFVar5->bl->firstlabel;
      iVar9 = (ls->dyd->label).n;
      l = &ls->dyd->label;
      if (iVar10 < iVar9) {
        lVar14 = (long)iVar9 - (long)iVar10;
        pLVar15 = l->arr + iVar10;
        do {
          if (pLVar15->name == pTVar13) {
            pcVar17 = luaO_pushfstring(pFVar5->ls->L,"label \'%s\' already defined on line %d",
                                       pTVar13 + 1,(ulong)(uint)pLVar15->line);
            semerror(pFVar5->ls,pcVar17);
          }
          pLVar15 = pLVar15 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      checknext(ls,0x120);
      iVar10 = luaK_getlabel(pFVar5);
      iVar10 = newlabelentry(ls,l,pTVar13,uVar4,iVar10);
      do {
        iVar9 = (ls->t).token;
        if (iVar9 < 0x120) {
          if (iVar9 != 0x3b) goto LAB_00113ca9;
        }
        else if (iVar9 != 0x120) {
          if (iVar9 == 0x121) goto LAB_00113cb7;
          goto LAB_00113e4d;
        }
        statement(ls);
      } while( true );
    }
    if (iVar10 == 0x3b) goto LAB_00113593;
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x113:
  case 0x114:
  case 0x115:
    suffixedexp(ls,&local_70);
    iVar10 = (ls->t).token;
    if ((iVar10 == 0x3d) || (iVar10 == 0x2c)) {
      local_78 = (undefined1  [8])0x0;
      assignment(ls,(LHS_assign *)local_78,1);
    }
    else {
      if (local_70.k != VCALL) {
        pcVar17 = "syntax error";
LAB_00113f5b:
        luaX_syntaxerror(ls,pcVar17);
      }
      pIVar8 = pFVar5->f->code;
      pIVar8[local_70.u.info] = pIVar8[local_70.u.info] & 0xff803fff | 0x4000;
    }
  }
LAB_00113eb8:
  ls->fs->freereg = ls->fs->nactvar;
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
LAB_00113ca9:
  if (iVar9 - 0x104U < 3) {
LAB_00113cb7:
    pLVar15 = l->arr;
    pLVar15[iVar10].nactvar = pFVar5->bl->nactvar;
  }
  else {
LAB_00113e4d:
    pLVar15 = l->arr;
  }
  findgotos(ls,pLVar15 + iVar10);
  goto LAB_00113eb8;
LAB_00113758:
  if (iVar10 - 0x104U < 3) {
LAB_00113762:
    leaveblock(pFVar6);
  }
  else {
LAB_001137bd:
    iVar10 = luaK_jump(pFVar6);
LAB_001137c8:
    statlist(ls);
    leaveblock(pFVar6);
    if (((ls->t).token & 0xfffffffeU) == 0x104) {
      iVar9 = luaK_jump(pFVar6);
      luaK_concat(pFVar6,&local_54,iVar9);
    }
    luaK_patchtohere(pFVar6,iVar10);
  }
  iVar10 = (ls->t).token;
  if (iVar10 != 0x105) goto code_r0x00113818;
  goto LAB_001136b3;
code_r0x00113818:
  if (iVar10 == 0x104) {
    luaX_next(ls);
    block(ls);
  }
  check_match(ls,0x106,0x10b,local_58);
  iVar10 = local_54;
LAB_00113b03:
  luaK_patchtohere(pFVar5,iVar10);
  goto LAB_00113eb8;
}

Assistant:

static void statement(LexState *ls) {
    int line = ls->linenumber;  /* may be needed for error messages */
    enterlevel(ls);
    switch (ls->t.token) {
        case ';': {  /* stat -> ';' (empty statement) */
            luaX_next(ls);  /* skip ';' */
            break;
        }
        case TK_IF: {  /* stat -> ifstat */
            ifstat(ls, line);
            break;
        }
        case TK_WHILE: {  /* stat -> whilestat */
            whilestat(ls, line);
            break;
        }
        case TK_DO: {  /* stat -> DO block END */
            luaX_next(ls);  /* skip DO */
            block(ls);
            check_match(ls, TK_END, TK_DO, line);
            break;
        }
        case TK_FOR: {  /* stat -> forstat */
            forstat(ls, line);
            break;
        }
        case TK_REPEAT: {  /* stat -> repeatstat */
            repeatstat(ls, line);
            break;
        }
        case TK_FUNCTION: {  /* stat -> funcstat */
            funcstat(ls, line);
            break;
        }
        case TK_LOCAL: {  /* stat -> localstat */
            luaX_next(ls);  /* skip LOCAL */
            if (testnext(ls, TK_FUNCTION))  /* local function? */
                localfunc(ls);
            else
                localstat(ls);
            break;
        }
        case TK_DBCOLON: {  /* stat -> label */
            luaX_next(ls);  /* skip double colon */
            labelstat(ls, str_checkname(ls), line);
            break;
        }
        case TK_RETURN: {  /* stat -> retstat */
            luaX_next(ls);  /* skip RETURN */
            retstat(ls);
            break;
        }
        case TK_BREAK:   /* stat -> breakstat */
        case TK_GOTO: {  /* stat -> 'goto' NAME */
            gotostat(ls, luaK_jump(ls->fs));
            break;
        }
        default: {  /* stat -> func | assignment */
            exprstat(ls);
            break;
        }
    }
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
    leavelevel(ls);
}